

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O0

char * tnt_strerror(tnt_stream *s)

{
  void *pvVar1;
  char *pcVar2;
  tnt_stream_net *sn;
  tnt_stream *s_local;
  
  pvVar1 = s->data;
  if (*(int *)((long)pvVar1 + 0xf0) == 3) {
    pcVar2 = strerror(*(int *)((long)pvVar1 + 0xf4));
    snprintf(tnt_strerror::msg,0x100,"%s (errno: %d)",pcVar2,(ulong)*(uint *)((long)pvVar1 + 0xf4));
    s_local = (tnt_stream *)tnt_strerror::msg;
  }
  else {
    s_local = (tnt_stream *)tnt_error_list[*(int *)((long)pvVar1 + 0xf0)].desc;
  }
  return (char *)s_local;
}

Assistant:

char *tnt_strerror(struct tnt_stream *s)
{
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if (sn->error == TNT_ESYSTEM) {
		static char msg[256];
		snprintf(msg, sizeof(msg), "%s (errno: %d)",
			 strerror(sn->errno_), sn->errno_);
		return msg;
	}
	return tnt_error_list[(int)sn->error].desc;
}